

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_catch::translate
          (method_catch *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  int iVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  statement_base *this_00;
  iterator ptr;
  var_id *this_01;
  string *psVar5;
  tree_type<cs::token_base_*> *t;
  shared_ptr<cs::context_type> *in_stack_fffffffffffffee8;
  internal_error *in_stack_fffffffffffffef0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffff00;
  context_t *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  allocator *paVar6;
  statement_catch *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar7;
  shared_ptr<cs::context_type> local_c8;
  tree_node *local_b8;
  string local_b0 [38];
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  tree_node *local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffff00);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
  local_20 = token_expr::get_tree((token_expr *)*pptVar2);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  if (*pptVar3 == (token_base *)0x0) {
    local_5d = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Null pointer accessed.",&local_49);
    internal_error::internal_error(in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
    local_5d = 0;
    __cxa_throw(uVar4,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_68 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  iVar1 = (*(*pptVar3)->_vptr_token_base[2])();
  if (iVar1 != 4) {
    local_8a = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    paVar6 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Wrong grammar for catch statement, expect <id>",paVar6);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffee8);
    local_8a = 0;
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  this_00 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffef0);
  uVar7 = 1;
  ptr = tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffee8);
  local_b8 = ptr.mData;
  pptVar3 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)CONCAT17(uVar7,in_stack_ffffffffffffff30));
  this_01 = token_id::get_id((token_id *)*pptVar3);
  psVar5 = (string *)var_id::operator_cast_to_string_(this_01);
  std::__cxx11::string::string(local_b0,psVar5);
  std::shared_ptr<cs::context_type>::shared_ptr(&local_c8,in_stack_fffffffffffffee8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
  statement_catch::statement_catch
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (token_base *)ptr.mData);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x55f538);
  std::__cxx11::string::~string(local_b0);
  return this_00;
}

Assistant:

statement_base *method_catch::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for catch statement, expect <id>");
		return new statement_catch(static_cast<token_id *>(t.root().data())->get_id(), context, raw.front().back());
	}